

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O3

int GetCode(gdIOCtx *fd,CODE_STATIC_DATA *scd,int code_size,int flag,int *ZeroDataBlockP)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  if (flag == 0) {
    iVar4 = scd->curbit;
    iVar1 = iVar4 + code_size;
    if (scd->lastbit <= iVar1) {
      if (scd->done != 0) {
        return -1;
      }
      scd->buf[0] = scd->buf[(long)scd->last_byte + -2];
      scd->buf[1] = scd->buf[(long)scd->last_byte + -1];
      iVar1 = GetDataBlock(fd,scd->buf + 2,ZeroDataBlockP);
      if (iVar1 < 1) {
        scd->done = 1;
      }
      scd->last_byte = iVar1 + 2;
      iVar3 = scd->curbit - scd->lastbit;
      iVar4 = iVar3 + 0x10;
      scd->curbit = iVar4;
      scd->lastbit = iVar1 * 8 + 0x10;
      iVar1 = iVar3 + code_size + 0x10;
    }
    uVar2 = 0xffffffff;
    if ((iVar1 < 0x8c1) && (uVar2 = 0, 0 < code_size)) {
      iVar3 = 0;
      do {
        uVar5 = iVar4 + iVar3;
        uVar6 = iVar4 + 7 + iVar3;
        if (-1 < (int)uVar5) {
          uVar6 = uVar5;
        }
        uVar2 = uVar2 | (uint)((scd->buf[(int)uVar6 >> 3] >> (uVar5 & 7) & 1) != 0) <<
                        ((byte)iVar3 & 0x1f);
        iVar3 = iVar3 + 1;
      } while (code_size != iVar3);
    }
    scd->curbit = iVar1;
  }
  else {
    scd->curbit = 0;
    scd->lastbit = 0;
    scd->done = 0;
    scd->last_byte = 2;
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static int
GetCode(gdIOCtx *fd, CODE_STATIC_DATA *scd, int code_size, int flag, int *ZeroDataBlockP)
{
	int rv;

	rv = GetCode_(fd, scd, code_size,flag, ZeroDataBlockP);

	if(VERBOSE) {
		printf("[GetCode(,%d,%d) returning %d]\n",code_size,flag,rv);
	}

	return rv;
}